

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_entry_isdir(zip_t *zip)

{
  uint uVar1;
  mz_zip_internal_state *pmVar2;
  uint uVar3;
  long lVar4;
  
  if (zip != (zip_t *)0x0) {
    uVar1 = (zip->entry).index;
    if (-1 < (int)uVar1) {
      uVar3 = 0;
      if ((((zip == (zip_t *)0x0) ||
           (pmVar2 = (zip->archive).m_pState, pmVar2 == (mz_zip_internal_state *)0x0)) ||
          ((zip->archive).m_total_files <= uVar1)) ||
         ((zip->archive).m_zip_mode != MZ_ZIP_MODE_READING)) {
        lVar4 = 0;
      }
      else {
        lVar4 = (ulong)*(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)uVar1 * 4) +
                (long)(pmVar2->m_central_dir).m_p;
      }
      if ((lVar4 != 0) &&
         (((ulong)*(ushort *)(lVar4 + 0x1c) == 0 ||
          (uVar3 = 1, *(char *)(lVar4 + 0x2d + (ulong)*(ushort *)(lVar4 + 0x1c)) != '/')))) {
        uVar3 = *(byte *)(lVar4 + 0x26) >> 4 & 1;
      }
      return uVar3;
    }
  }
  return -1;
}

Assistant:

int zip_entry_isdir(struct zip_t *zip) {
  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  if (zip->entry.index < 0) {
    // zip entry is not opened
    return -1;
  }

  return (int)mz_zip_reader_is_file_a_directory(&zip->archive,
                                                (mz_uint)zip->entry.index);
}